

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poolresourcetester.h
# Opt level: O2

void PoolResourceTester::CheckAllDataAccountedFor<128ul,8ul>(PoolResource<128UL,_8UL> *resource)

{
  long lVar1;
  ulong uVar2;
  uint __line;
  ulong uVar3;
  pointer pPVar4;
  size_t freelist_idx;
  long lVar5;
  _List_node_base *p_Var6;
  ulong uVar7;
  char *__assertion;
  ulong uVar8;
  pointer pPVar9;
  long in_FS_OFFSET;
  bool bVar10;
  size_t local_88;
  byte *ptr;
  vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_> chunks;
  long num_available_bytes;
  vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
  free_blocks;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  free_blocks.
  super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  free_blocks.
  super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  free_blocks.
  super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar5 = 0; lVar5 != 0x11; lVar5 = lVar5 + 1) {
    chunks.
    super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(lVar5 * 8);
    num_available_bytes = (long)((resource->m_free_lists)._M_elems + lVar5);
    while (num_available_bytes = *(long *)num_available_bytes,
          (ListNode *)num_available_bytes != (ListNode *)0x0) {
      std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>::
      emplace_back<PoolResource<128ul,8ul>::ListNode*&,unsigned_long&>
                ((vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>
                  *)&free_blocks,(ListNode **)&num_available_bytes,(unsigned_long *)&chunks);
    }
  }
  num_available_bytes =
       (long)resource->m_available_memory_end - (long)resource->m_available_memory_it;
  if (0 < num_available_bytes) {
    std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>::
    emplace_back<std::byte*const&,long&>
              ((vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>
                *)&free_blocks,&resource->m_available_memory_it,&num_available_bytes);
  }
  chunks.
  super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  chunks.
  super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  chunks.
  super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var6 = (_List_node_base *)&resource->m_allocated_chunks;
  while (p_Var6 = (((_List_base<std::byte_*,_std::allocator<std::byte_*>_> *)&p_Var6->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)&resource->m_allocated_chunks) {
    ptr = (byte *)p_Var6[1]._M_next;
    local_88 = resource->m_chunk_size_bytes;
    std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>::
    emplace_back<std::byte_const*&,unsigned_long>
              ((vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>
                *)&chunks,&ptr,&local_88);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<PoolResourceTester::PtrAndBytes*,std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (free_blocks.
             super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
             ._M_impl.super__Vector_impl_data._M_start,
             free_blocks.
             super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<PoolResourceTester::PtrAndBytes*,std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (chunks.
             super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
             ._M_impl.super__Vector_impl_data._M_start,
             chunks.
             super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  uVar7 = (chunks.
           super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
           ._M_impl.super__Vector_impl_data._M_start)->ptr;
  uVar3 = (chunks.
           super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
           ._M_impl.super__Vector_impl_data._M_start)->size;
  pPVar4 = free_blocks.
           super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = uVar7;
  pPVar9 = chunks.
           super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pPVar4 == free_blocks.
                  super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (uVar8 == uVar7 + pPVar9->size) {
        if (pPVar9 + 1 ==
            chunks.
            super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (uVar3 == 0) {
            std::
            _Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
            ::~_Vector_base(&chunks.
                             super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
                           );
            std::
            _Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
            ::~_Vector_base(&free_blocks.
                             super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
                           );
            if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
              __stack_chk_fail();
            }
            return;
          }
          __assertion = "chunk_size_remaining == 0";
          __line = 0x7d;
        }
        else {
          __assertion = "chunk_it == chunks.end()";
          __line = 0x7c;
        }
      }
      else {
        __assertion = "chunk_ptr_remaining == chunk_it->ptr + chunk_it->size";
        __line = 0x7a;
      }
LAB_0043d3cd:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                    ,__line,
                    "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 128UL, ALIGN_BYTES = 8UL]"
                   );
    }
    if (uVar3 == 0) {
      if (pPVar9 == chunks.
                    super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        __assertion = "chunk_it != chunks.end()";
        __line = 0x6d;
        goto LAB_0043d3cd;
      }
      if (pPVar9 + 1 ==
          chunks.
          super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assertion = "chunk_it != chunks.end()";
        __line = 0x6f;
        goto LAB_0043d3cd;
      }
      uVar7 = pPVar9[1].ptr;
      uVar3 = pPVar9[1].size;
      uVar8 = uVar7;
      pPVar9 = pPVar9 + 1;
    }
    if (pPVar4->ptr != uVar8) {
      __assertion = "free_block.ptr == chunk_ptr_remaining";
      __line = 0x73;
      goto LAB_0043d3cd;
    }
    uVar2 = pPVar4->size;
    bVar10 = uVar3 < uVar2;
    uVar3 = uVar3 - uVar2;
    if (bVar10) {
      __assertion = "free_block.size <= chunk_size_remaining";
      __line = 0x74;
      goto LAB_0043d3cd;
    }
    if ((uVar8 & 7) != 0) {
      __assertion = "(free_block.ptr & (resource.ELEM_ALIGN_BYTES - 1)) == 0";
      __line = 0x75;
      goto LAB_0043d3cd;
    }
    uVar8 = uVar8 + uVar2;
    pPVar4 = pPVar4 + 1;
  } while( true );
}

Assistant:

static void CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES>& resource)
    {
        // collect all free blocks by iterating all freelists
        std::vector<PtrAndBytes> free_blocks;
        for (std::size_t freelist_idx = 0; freelist_idx < resource.m_free_lists.size(); ++freelist_idx) {
            std::size_t bytes = freelist_idx * resource.ELEM_ALIGN_BYTES;
            auto* ptr = resource.m_free_lists[freelist_idx];
            while (ptr != nullptr) {
                free_blocks.emplace_back(ptr, bytes);
                ptr = ptr->m_next;
            }
        }
        // also add whatever has not yet been used for blocks
        auto num_available_bytes = resource.m_available_memory_end - resource.m_available_memory_it;
        if (num_available_bytes > 0) {
            free_blocks.emplace_back(resource.m_available_memory_it, num_available_bytes);
        }

        // collect all chunks
        std::vector<PtrAndBytes> chunks;
        for (const std::byte* ptr : resource.m_allocated_chunks) {
            chunks.emplace_back(ptr, resource.ChunkSizeBytes());
        }

        // now we have all the data from all freelists on the one hand side, and all chunks on the other hand side.
        // To check if all of them match, sort by address and iterate.
        std::sort(free_blocks.begin(), free_blocks.end());
        std::sort(chunks.begin(), chunks.end());

        auto chunk_it = chunks.begin();
        auto chunk_ptr_remaining = chunk_it->ptr;
        auto chunk_size_remaining = chunk_it->size;
        for (const auto& free_block : free_blocks) {
            if (chunk_size_remaining == 0) {
                assert(chunk_it != chunks.end());
                ++chunk_it;
                assert(chunk_it != chunks.end());
                chunk_ptr_remaining = chunk_it->ptr;
                chunk_size_remaining = chunk_it->size;
            }
            assert(free_block.ptr == chunk_ptr_remaining);                   // ensure addresses match
            assert(free_block.size <= chunk_size_remaining);                 // ensure no overflow
            assert((free_block.ptr & (resource.ELEM_ALIGN_BYTES - 1)) == 0); // ensure correct alignment
            chunk_ptr_remaining += free_block.size;
            chunk_size_remaining -= free_block.size;
        }
        // ensure we are at the end of the chunks
        assert(chunk_ptr_remaining == chunk_it->ptr + chunk_it->size);
        ++chunk_it;
        assert(chunk_it == chunks.end());
        assert(chunk_size_remaining == 0);
    }